

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Quat4f.cpp
# Opt level: O0

Quat4f Quat4f::slerp(Quat4f *a,Quat4f *b,float t,bool allowFlip)

{
  float *pfVar1;
  byte in_CL;
  Quat4f *in_RDX;
  Quat4f *in_RSI;
  Quat4f *in_RDI;
  float in_XMM0_Da;
  float fVar2;
  float fVar3;
  double dVar4;
  double dVar5;
  ulong uVar6;
  undefined8 extraout_XMM0_Qb;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  ulong uVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  Quat4f QVar12;
  float sinAngle;
  float angle;
  float c2;
  float c1;
  float cosAngle;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  undefined4 local_2c;
  undefined4 local_28;
  
  fVar2 = dot((Quat4f *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
              (Quat4f *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  auVar7._0_8_ = (double)fVar2;
  auVar7._8_8_ = extraout_XMM0_Qb;
  auVar10._8_8_ = 0x7fffffffffffffff;
  auVar10._0_8_ = 0x7fffffffffffffff;
  auVar7 = vpand_avx(auVar7,auVar10);
  if (0.009999999776482582 <= 1.0 - auVar7._0_8_) {
    auVar8._0_8_ = (double)fVar2;
    auVar8._8_8_ = 0;
    auVar11._8_8_ = 0x7fffffffffffffff;
    auVar11._0_8_ = 0x7fffffffffffffff;
    auVar7 = vpand_avx(auVar8,auVar11);
    dVar4 = acos(auVar7._0_8_);
    fVar3 = (float)dVar4;
    dVar4 = sin((double)fVar3);
    dVar5 = sin((double)(fVar3 * (1.0 - in_XMM0_Da)));
    local_28 = (float)(dVar5 / (double)(float)dVar4);
    dVar5 = sin((double)(fVar3 * in_XMM0_Da));
    local_2c = (float)(dVar5 / (double)(float)dVar4);
  }
  else {
    local_28 = 1.0 - in_XMM0_Da;
    local_2c = in_XMM0_Da;
  }
  if (((in_CL & 1) != 0) && (fVar2 < 0.0)) {
    local_28 = -local_28;
  }
  pfVar1 = operator[](in_RSI,0);
  fVar2 = *pfVar1;
  pfVar1 = operator[](in_RDX,0);
  auVar7 = vfmadd213ss_fma(ZEXT416((uint)fVar2),ZEXT416((uint)local_28),
                           ZEXT416((uint)(local_2c * *pfVar1)));
  pfVar1 = operator[](in_RSI,1);
  fVar2 = *pfVar1;
  pfVar1 = operator[](in_RDX,1);
  auVar10 = vfmadd213ss_fma(ZEXT416((uint)fVar2),ZEXT416((uint)local_28),
                            ZEXT416((uint)(local_2c * *pfVar1)));
  fVar3 = local_28;
  pfVar1 = operator[](in_RSI,2);
  fVar2 = *pfVar1;
  pfVar1 = operator[](in_RDX,2);
  auVar8 = vfmadd213ss_fma(ZEXT416((uint)fVar2),ZEXT416((uint)fVar3),
                           ZEXT416((uint)(local_2c * *pfVar1)));
  pfVar1 = operator[](in_RSI,3);
  fVar2 = *pfVar1;
  pfVar1 = operator[](in_RDX,3);
  uVar6 = (ulong)(uint)auVar7._0_4_;
  uVar9 = (ulong)(uint)auVar10._0_4_;
  auVar11 = vfmadd213ss_fma(ZEXT416((uint)fVar2),ZEXT416((uint)local_28),
                            ZEXT416((uint)(local_2c * *pfVar1)));
  Quat4f(in_RDI,auVar7._0_4_,auVar10._0_4_,auVar8._0_4_,auVar11._0_4_);
  QVar12.m_elements[2] = (float)(int)uVar9;
  QVar12.m_elements[3] = (float)(int)(uVar9 >> 0x20);
  QVar12.m_elements[0] = (float)(int)uVar6;
  QVar12.m_elements[1] = (float)(int)(uVar6 >> 0x20);
  return (Quat4f)QVar12.m_elements;
}

Assistant:

Quat4f Quat4f::slerp( const Quat4f& a, const Quat4f& b, float t, bool allowFlip )
{
	float cosAngle = Quat4f::dot( a, b );

	float c1;
	float c2;

	// Linear interpolation for close orientations
	if( ( 1.0f - fabs( cosAngle ) ) < 0.01f )
	{
		c1 = 1.0f - t;
		c2 = t;
	}
	else
	{
		// Spherical interpolation
		float angle = acos( fabs( cosAngle ) );
		float sinAngle = sin( angle );
		c1 = sin( angle * ( 1.0f - t ) ) / sinAngle;
		c2 = sin( angle * t ) / sinAngle;
	}

	// Use the shortest path
	if( allowFlip && ( cosAngle < 0.0f ) )
	{
		c1 = -c1;
	}

	return Quat4f( c1 * a[ 0 ] + c2 * b[ 0 ], c1 * a[ 1 ] + c2 * b[ 1 ], c1 * a[ 2 ] + c2 * b[ 2 ], c1 * a[ 3 ] + c2 * b[ 3 ] );
}